

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskflow.hpp
# Opt level: O3

void __thiscall tf::Taskflow::_dump(Taskflow *this,ostream *os,Graph *top)

{
  size_type sVar1;
  undefined1 auVar2 [8];
  mapped_type *pmVar3;
  ostream *poVar4;
  Dumper dumper;
  char local_d9;
  pair<const_tf::Node_*,_const_tf::Graph_*> local_d8;
  Graph *local_c8;
  undefined1 local_c0 [8];
  _Deque_base<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>
  local_b8;
  _Hashtable<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_c8 = top;
  std::
  _Deque_base<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>
  ::_M_initialize_map(&local_b8,0);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_c0 = (undefined1  [8])0x0;
  local_d8.first = (Node *)0x0;
  local_d8.second = top;
  std::
  deque<std::pair<tf::Node_const*,tf::Graph_const*>,std::allocator<std::pair<tf::Node_const*,tf::Graph_const*>>>
  ::emplace_back<std::pair<tf::Node_const*,tf::Graph_const*>>
            ((deque<std::pair<tf::Node_const*,tf::Graph_const*>,std::allocator<std::pair<tf::Node_const*,tf::Graph_const*>>>
              *)&local_b8,&local_d8);
  auVar2 = local_c0;
  local_c0 = (undefined1  [8])((long)local_c0 + 1);
  pmVar3 = std::__detail::
           _Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_68,&local_c8);
  *pmVar3 = (mapped_type)auVar2;
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        local_d8.first = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first;
        local_d8.second = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second
        ;
        operator_delete(local_b8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_d8.first = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first;
        local_d8.second = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"subgraph cluster_p",0x12);
      poVar4 = std::ostream::_M_insert<void_const*>(os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," {\nlabel=\"",10);
      if (local_d8.first == (Node *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"Taskflow: ",10);
        sVar1 = (this->_name)._M_string_length;
        if (sVar1 == 0) {
          local_d9 = 'p';
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_d9,1);
          std::ostream::_M_insert<void_const*>(poVar4);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,(this->_name)._M_dataplus._M_p,sVar1);
        }
      }
      else {
        local_d9 = 'm';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_d9,1);
        std::__detail::
        _Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        ::operator[]((_Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&local_68,&local_d8.second);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"\";\n",3);
      _dump(this,os,local_d8.second,(Dumper *)local_c0);
      std::__ostream_insert<char,std::char_traits<char>>(os,"}\n",2);
    } while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  _Hashtable<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Deque_base<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>
  ::~_Deque_base(&local_b8);
  return;
}

Assistant:

inline void Taskflow::_dump(std::ostream& os, const Graph* top) const {

  Dumper dumper;

  dumper.id = 0;
  dumper.stack.push({nullptr, top});
  dumper.visited[top] = dumper.id++;

  while(!dumper.stack.empty()) {

    auto [p, f] = dumper.stack.top();
    dumper.stack.pop();

    os << "subgraph cluster_p" << f << " {\nlabel=\"";

    // n-level module
    if(p) {
      os << 'm' << dumper.visited[f];
    }
    // top-level taskflow graph
    else {
      os << "Taskflow: ";
      if(_name.empty()) os << 'p' << this;
      else os << _name;
    }

    os << "\";\n";

    _dump(os, f, dumper);
    os << "}\n";
  }
}